

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

void __thiscall QProcess::start(QProcess *this,OpenMode mode)

{
  QProcessPrivate *this_00;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QProcessPrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  if (this_00->processState == '\0') {
    if ((this_00->program).d.size != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QProcessPrivate::start(this_00,mode);
        return;
      }
      goto LAB_0041d986;
    }
    QMetaObject::tr(&local_30,&staticMetaObject,"No program defined",(char *)0x0,-1);
    QProcessPrivate::setErrorAndEmit(this_00,FailedToStart,&local_30);
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    start();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0041d986:
  __stack_chk_fail();
}

Assistant:

void QProcess::start(OpenMode mode)
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning("QProcess::start: Process is already running");
        return;
    }
    if (d->program.isEmpty()) {
        d->setErrorAndEmit(QProcess::FailedToStart, tr("No program defined"));
        return;
    }

    d->start(mode);
}